

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::ParseGoogleTestFlag(char *arg)

{
  bool bVar1;
  
  bVar1 = ParseBoolFlag(arg,"also_run_disabled_tests",(bool *)&FLAGS_gtest_also_run_disabled_tests);
  if (!bVar1) {
    bVar1 = ParseBoolFlag(arg,"break_on_failure",(bool *)&FLAGS_gtest_break_on_failure);
    if (!bVar1) {
      bVar1 = ParseBoolFlag(arg,"catch_exceptions",(bool *)&FLAGS_gtest_catch_exceptions);
      if (!bVar1) {
        bVar1 = ParseStringFlag(arg,"color",(string *)&FLAGS_gtest_color_abi_cxx11_);
        if (!bVar1) {
          bVar1 = ParseStringFlag(arg,"death_test_style",
                                  (string *)FLAGS_gtest_death_test_style_abi_cxx11_);
          if (!bVar1) {
            bVar1 = ParseBoolFlag(arg,"death_test_use_fork",(bool *)&FLAGS_gtest_death_test_use_fork
                                 );
            if (!bVar1) {
              bVar1 = ParseStringFlag(arg,"filter",(string *)&FLAGS_gtest_filter_abi_cxx11_);
              if (!bVar1) {
                bVar1 = ParseStringFlag(arg,"internal_run_death_test",
                                        (string *)&FLAGS_gtest_internal_run_death_test_abi_cxx11_);
                if (!bVar1) {
                  bVar1 = ParseBoolFlag(arg,"list_tests",(bool *)&FLAGS_gtest_list_tests);
                  if (!bVar1) {
                    bVar1 = ParseStringFlag(arg,"output",(string *)&FLAGS_gtest_output_abi_cxx11_);
                    if (!bVar1) {
                      bVar1 = ParseBoolFlag(arg,"print_time",(bool *)&FLAGS_gtest_print_time);
                      if (!bVar1) {
                        bVar1 = ParseInt32Flag(arg,"random_seed",&FLAGS_gtest_random_seed);
                        if (!bVar1) {
                          bVar1 = ParseInt32Flag(arg,"repeat",&FLAGS_gtest_repeat);
                          if (!bVar1) {
                            bVar1 = ParseBoolFlag(arg,"shuffle",(bool *)&FLAGS_gtest_shuffle);
                            if (!bVar1) {
                              bVar1 = ParseInt32Flag(arg,"stack_trace_depth",
                                                     &FLAGS_gtest_stack_trace_depth);
                              if (!bVar1) {
                                bVar1 = ParseStringFlag(arg,"stream_result_to",
                                                        (string *)
                                                        &FLAGS_gtest_stream_result_to_abi_cxx11_);
                                if (!bVar1) {
                                  bVar1 = ParseBoolFlag(arg,"throw_on_failure",
                                                        (bool *)&FLAGS_gtest_throw_on_failure);
                                  return bVar1;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool ParseGoogleTestFlag(const char* const arg) {
  return ParseBoolFlag(arg, kAlsoRunDisabledTestsFlag,
                       &GTEST_FLAG(also_run_disabled_tests)) ||
      ParseBoolFlag(arg, kBreakOnFailureFlag,
                    &GTEST_FLAG(break_on_failure)) ||
      ParseBoolFlag(arg, kCatchExceptionsFlag,
                    &GTEST_FLAG(catch_exceptions)) ||
      ParseStringFlag(arg, kColorFlag, &GTEST_FLAG(color)) ||
      ParseStringFlag(arg, kDeathTestStyleFlag,
                      &GTEST_FLAG(death_test_style)) ||
      ParseBoolFlag(arg, kDeathTestUseFork,
                    &GTEST_FLAG(death_test_use_fork)) ||
      ParseStringFlag(arg, kFilterFlag, &GTEST_FLAG(filter)) ||
      ParseStringFlag(arg, kInternalRunDeathTestFlag,
                      &GTEST_FLAG(internal_run_death_test)) ||
      ParseBoolFlag(arg, kListTestsFlag, &GTEST_FLAG(list_tests)) ||
      ParseStringFlag(arg, kOutputFlag, &GTEST_FLAG(output)) ||
      ParseBoolFlag(arg, kPrintTimeFlag, &GTEST_FLAG(print_time)) ||
      ParseInt32Flag(arg, kRandomSeedFlag, &GTEST_FLAG(random_seed)) ||
      ParseInt32Flag(arg, kRepeatFlag, &GTEST_FLAG(repeat)) ||
      ParseBoolFlag(arg, kShuffleFlag, &GTEST_FLAG(shuffle)) ||
      ParseInt32Flag(arg, kStackTraceDepthFlag,
                     &GTEST_FLAG(stack_trace_depth)) ||
      ParseStringFlag(arg, kStreamResultToFlag,
                      &GTEST_FLAG(stream_result_to)) ||
      ParseBoolFlag(arg, kThrowOnFailureFlag,
                    &GTEST_FLAG(throw_on_failure));
}